

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testError.cpp
# Opt level: O3

void anon_unknown.dwarf_10eb42::testDenormalizedRounding(int n)

{
  char cVar1;
  uint uVar2;
  ostream *poVar3;
  byte bVar4;
  ulong uVar5;
  float fVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float local_4c;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rounding denormalized numbers to ",0x21);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-bit precision\n",0xf);
  fVar12 = 0.0;
  uVar5 = 0;
  local_4c = 0.0;
  if (n < 10) {
    uVar5 = (ulong)(10 - n);
    local_4c = (float)(double)((uVar5 << 0x34) + 0x3e600000001c5f68);
  }
  iVar8 = 200000;
  uVar7 = 0;
  while( true ) {
    fVar11 = drand();
    fVar6 = ABS(fVar11 * 6.097555e-05);
    uVar2 = (uint)(fVar11 * 6.097555e-05) >> 0x10 & 0x8000;
    if ((uint)fVar6 < 0x38800000) {
      if ((0x33000000 < (uint)fVar6) &&
         (uVar10 = (uint)fVar6 & 0x7fffff | 0x800000, cVar1 = (char)((uint)fVar6 >> 0x17),
         uVar2 = uVar2 | uVar10 >> (0x7eU - cVar1 & 0x1f),
         0x80000000 < uVar10 << (cVar1 + 0xa2U & 0x1f))) {
        uVar2 = uVar2 + 1;
      }
    }
    else if ((uint)fVar6 < 0x7f800000) {
      if ((uint)fVar6 < 0x477ff000) {
        uVar2 = (int)fVar6 + 0x8000fff + (uint)(((uint)fVar6 >> 0xd & 1) != 0) >> 0xd | uVar2;
      }
      else {
        uVar2 = uVar2 | 0x7c00;
      }
    }
    else {
      uVar2 = uVar2 | 0x7c00;
      if (fVar6 != INFINITY) {
        uVar10 = (uint)fVar6 >> 0xd & 0x3ff;
        uVar2 = uVar2 | uVar10 | (uint)(uVar10 == 0);
      }
    }
    uVar9 = uVar2 ^ uVar7;
    uVar10 = uVar9;
    if ((uint)n < 10) {
      bVar4 = (byte)(9U - n);
      uVar2 = ((uVar2 & 0x7fff) >> (bVar4 & 0x1f)) +
              (uint)(((uVar2 & 0x7fff) >> (9U - n & 0x1f) & 1) != 0) << (bVar4 & 0x1f);
      uVar10 = uVar9 & -1 << ((byte)uVar5 & 0x1f);
      if ((uVar2 & 0xfc00) < 0x7c00) {
        uVar10 = uVar2;
      }
      uVar10 = uVar10 | uVar9 & 0xffff8000;
    }
    fVar11 = *(float *)(_imath_half_to_float_table + (ulong)(uVar10 & 0xffff) * 4) -
             *(float *)(_imath_half_to_float_table + (ulong)(uVar9 & 0xffff) * 4);
    fVar6 = -fVar11;
    if (-fVar11 <= fVar11) {
      fVar6 = fVar11;
    }
    if (local_4c < fVar6) break;
    if (fVar6 <= fVar12) {
      fVar6 = fVar12;
    }
    fVar12 = fVar6;
    uVar7 = uVar7 - 0x8000;
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"max error          = ",0x15);
      poVar3 = std::ostream::_M_insert<double>((double)fVar12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"max expected error = ",0x15);
      poVar3 = std::ostream::_M_insert<double>((double)local_4c);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n\n",4);
      std::ostream::flush();
      return;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"half = ");
  poVar3 = (ostream *)operator<<(poVar3,(half)(uint16_t)uVar9);
  poVar3 = std::operator<<(poVar3,", rounded = ");
  poVar3 = (ostream *)operator<<(poVar3,(half)(uint16_t)uVar10);
  poVar3 = std::operator<<(poVar3,", error = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar6);
  poVar3 = std::operator<<(poVar3,", expected error = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_4c);
  std::endl<char,std::char_traits<char>>(poVar3);
  printBits((ostream *)&std::cout,(half)(uint16_t)uVar9);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  printBits((ostream *)&std::cout,(half)(uint16_t)uVar10);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testError.cpp"
                ,0xb1,"void (anonymous namespace)::testDenormalizedRounding(int)");
}

Assistant:

void
testDenormalizedRounding (int n)
{
    cout << "rounding denormalized numbers to " << n << "-bit precision\n";

    float eExpected = (n < 10) ? HALF_DENORM_MIN * 0.5f * (1 << (10 - n)) : 0;
    float eMax      = 0;

    for (int i = 0; i < 200000; i++)
    {
        half h (drand () * (HALF_NRM_MIN - HALF_DENORM_MIN));

        if (i & 1) h = -h;

        half  r (h.round (n));
        float e = r - h;

        if (e < 0) e = -e;

        if (e > eExpected)
        {
            cout << "half = " << h << ", rounded = " << r << ", error = " << e
                 << ", expected error = " << eExpected << endl;

            printBits (cout, h);
            cout << endl;
            printBits (cout, r);
            cout << endl;

            assert (false);
        }

        if (e > eMax) eMax = e;
    }

    cout << "max error          = " << eMax << endl;
    cout << "max expected error = " << eExpected << endl;
    cout << "ok\n\n" << flush;
}